

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::presolveChangedRows(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *in_RDI;
  Result __result;
  HighsInt row;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> changedRows;
  HighsInt in_stack_0000082c;
  HighsPostsolveStack *in_stack_00000830;
  HPresolve *in_stack_00000838;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  Result in_stack_ffffffffffffff84;
  vector<int,_std::allocator<int>_> *this_00;
  size_type in_stack_ffffffffffffffa8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffb0;
  vector<int,_std::allocator<int>_> local_30;
  Result local_4;
  
  this_00 = &local_30;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x70780a);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffb0._M_current,
             in_stack_ffffffffffffffa8);
  std::vector<int,_std::allocator<int>_>::swap(this_00,in_RDI);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_ffffffffffffff78), bVar2) {
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &stack0xffffffffffffffb0);
    iVar1 = *piVar3;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &in_RDI[0x3d].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)iVar1);
    if (*pvVar4 == '\0') {
      in_stack_ffffffffffffff84 = rowPresolve(in_stack_00000838,in_stack_00000830,in_stack_0000082c)
      ;
      local_4 = in_stack_ffffffffffffff84;
      if (in_stack_ffffffffffffff84 != kOk) goto LAB_0070796c;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &in_RDI[0x3d].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)iVar1);
      in_stack_ffffffffffffff80 = CONCAT13(*pvVar4,(int3)in_stack_ffffffffffffff80);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &in_RDI[0x31].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)iVar1);
      *pvVar4 = (value_type)((uint)in_stack_ffffffffffffff80 >> 0x18);
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffb0);
  }
  local_4 = kOk;
LAB_0070796c:
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  return local_4;
}

Assistant:

HPresolve::Result HPresolve::presolveChangedRows(
    HighsPostsolveStack& postsolve_stack) {
  std::vector<HighsInt> changedRows;
  changedRows.reserve(model->num_row_ - numDeletedRows);
  changedRows.swap(changedRowIndices);
  for (HighsInt row : changedRows) {
    if (rowDeleted[row]) continue;
    HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, row));
    changedRowFlag[row] = rowDeleted[row];
  }

  return Result::kOk;
}